

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioned_hashtable.cpp
# Opt level: O1

void __thiscall
duckdb::RadixHTConfig::RadixHTConfig(RadixHTConfig *this,RadixHTGlobalSinkState *sink_p)

{
  ulong uVar1;
  type pTVar2;
  uint64_t uVar3;
  idx_t iVar4;
  uint64_t uVar5;
  ulong uVar6;
  
  this->sink = sink_p;
  this->number_of_threads = sink_p->number_of_threads;
  pTVar2 = shared_ptr<duckdb::TupleDataLayout,_true>::operator*(&sink_p->radix_ht->layout_ptr);
  uVar1 = pTVar2->row_width;
  this->row_width = uVar1;
  uVar6 = 0x40;
  if (uVar1 < 0x40) {
    uVar6 = uVar1;
  }
  uVar3 = NextPowerOfTwo(((this->number_of_threads * 0xc0000) / this->number_of_threads + 0x84000) /
                         (uVar6 + 10));
  uVar5 = 0x1000;
  if (0x1000 < uVar3) {
    uVar5 = uVar3;
  }
  this->sink_capacity = uVar5;
  iVar4 = InitialSinkRadixBits(this);
  (this->sink_radix_bits).super___atomic_base<unsigned_long>._M_i = iVar4;
  if (this->number_of_threads < 3) {
    iVar4 = InitialSinkRadixBits(this);
  }
  else {
    iVar4 = 6;
    if (this->row_width < 0x40) {
      iVar4 = (ulong)(this->row_width < 0x20) + 7;
    }
  }
  this->maximum_sink_radix_bits = iVar4;
  return;
}

Assistant:

RadixHTConfig::RadixHTConfig(RadixHTGlobalSinkState &sink_p)
    : sink(sink_p), number_of_threads(sink.number_of_threads), row_width(sink.radix_ht.GetLayout().GetRowWidth()),
      sink_capacity(SinkCapacity()), sink_radix_bits(InitialSinkRadixBits()),
      maximum_sink_radix_bits(MaximumSinkRadixBits()) {
}